

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawSwitchableImage::Tick
          (CommandDrawSwitchableImage *this,SBarInfoMainBlock *block,DSBarInfo *statusBar,
          bool hudChanged)

{
  APlayerPawn *pAVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  PClassWeapon *type;
  AInventory *pAVar6;
  PClassActor *pPVar7;
  FTexture *pFVar8;
  bool local_99;
  bool local_8a;
  bool local_89;
  bool secondCondition;
  AInventory *item_1;
  bool matches2;
  bool matches1;
  AInventory *pAStack_58;
  ABasicArmor *armor;
  FName species;
  int keynum;
  AInventory *item;
  bool found2;
  bool found1;
  PClassActor *weap;
  uint local_28;
  int i;
  int drawAlt;
  bool hudChanged_local;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  CommandDrawSwitchableImage *this_local;
  
  local_28 = 0;
  if (this->condition == WEAPONSLOT) {
    local_28 = 1;
    for (weap._4_4_ = 0;
        iVar5 = FWeaponSlot::Size((((statusBar->super_DBaseStatusBar).CPlayer)->weapons).Slots +
                                  this->conditionalValue[0]), weap._4_4_ < iVar5;
        weap._4_4_ = weap._4_4_ + 1) {
      type = FWeaponSlot::GetWeapon
                       ((((statusBar->super_DBaseStatusBar).CPlayer)->weapons).Slots +
                        this->conditionalValue[0],weap._4_4_);
      if ((type != (PClassWeapon *)0x0) &&
         (pAVar6 = AActor::FindInventory
                             (&((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor,
                              (PClassActor *)type,false), pAVar6 != (AInventory *)0x0)) {
        local_28 = 0;
        break;
      }
    }
  }
  else if (this->condition == INVULNERABILITY) {
    local_28 = (uint)((((statusBar->super_DBaseStatusBar).CPlayer)->cheats & 0x2000002U) != 0);
  }
  else if (this->condition == KEYSLOT) {
    bVar4 = false;
    bVar2 = false;
    local_28 = 1;
    for (_species = ::TObjPtr::operator_cast_to_AInventory_
                              ((TObjPtr *)
                               &(((statusBar->super_DBaseStatusBar).CPlayer)->mo->super_AActor).
                                Inventory); _species != (AInventory *)0x0;
        _species = ::TObjPtr::operator_cast_to_AInventory_
                             ((TObjPtr *)&(_species->super_AActor).Inventory)) {
      bVar3 = DObject::IsKindOf((DObject *)_species,AKey::RegistrationInfo.MyClass);
      if (bVar3) {
        armor._4_4_ = (uint)(byte)_species->field_0x4fc;
        if (armor._4_4_ == 0) {
          AActor::GetSpecies((AActor *)&armor);
          bVar3 = FName::operator==((FName *)&armor,this->keySpecies);
          if (bVar3) {
            bVar4 = true;
          }
          if (((this->conditionAnd & 1U) != 0) &&
             (bVar3 = FName::operator==((FName *)&armor,this->keySpecies + 1), bVar3)) {
            bVar2 = true;
          }
        }
        else {
          if (armor._4_4_ == this->conditionalValue[0]) {
            bVar4 = true;
          }
          if (((this->conditionAnd & 1U) != 0) && (armor._4_4_ == this->conditionalValue[1])) {
            bVar2 = true;
          }
        }
      }
    }
    if ((this->conditionAnd & 1U) == 0) {
      local_28 = (uint)!bVar4;
    }
    else if ((bVar4) && (bVar2)) {
      local_28 = 0;
    }
    else if (bVar4) {
      local_28 = 2;
    }
    else if (bVar2) {
      local_28 = 3;
    }
  }
  else if (this->condition == ARMORTYPE) {
    pAVar1 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    FName::FName((FName *)((long)&item_1 + 4),NAME_BasicArmor);
    pAStack_58 = AActor::FindInventory(&pAVar1->super_AActor,(FName *)((long)&item_1 + 4));
    if (pAStack_58 != (AInventory *)0x0) {
      iVar5 = FName::GetIndex((FName *)((long)&pAStack_58[1].super_AActor.super_DThinker.
                                               super_DObject.ObjNext + 4));
      local_89 = false;
      if (iVar5 == this->armorType[0]) {
        local_89 = EvaluateOperation(this->conditionalOperator,this->conditionalValue,
                                     &pAStack_58->Amount);
      }
      item_1._3_1_ = local_89;
      iVar5 = FName::GetIndex((FName *)((long)&pAStack_58[1].super_AActor.super_DThinker.
                                               super_DObject.ObjNext + 4));
      local_8a = false;
      if (iVar5 == this->armorType[1]) {
        local_8a = EvaluateOperation(this->conditionalOperator + 1,this->conditionalValue + 1,
                                     &pAStack_58->Amount);
      }
      item_1._2_1_ = local_8a;
      local_28 = 1;
      if ((this->conditionAnd & 1U) == 0) {
        local_28 = (uint)((item_1._3_1_ & 1) == 0);
      }
      else if (((item_1._3_1_ & 1) == 0) || (local_8a == false)) {
        if (local_8a == false) {
          if ((item_1._3_1_ & 1) != 0) {
            local_28 = 2;
          }
        }
        else {
          local_28 = 3;
        }
      }
      else {
        local_28 = 0;
      }
    }
  }
  else {
    pAVar1 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
    pPVar7 = PClass::FindActor(this->inventoryItem);
    pAVar6 = AActor::FindInventory(&pAVar1->super_AActor,pPVar7,false);
    if ((pAVar6 == (AInventory *)0x0) ||
       (bVar4 = EvaluateOperation(this->conditionalOperator,this->conditionalValue,&pAVar6->Amount),
       !bVar4)) {
      local_28 = 1;
    }
    if ((this->conditionAnd & 1U) != 0) {
      pAVar1 = ((statusBar->super_DBaseStatusBar).CPlayer)->mo;
      pPVar7 = PClass::FindActor(this->inventoryItem + 1);
      pAVar6 = AActor::FindInventory(&pAVar1->super_AActor,pPVar7,false);
      local_99 = false;
      if (((pAVar6 == (AInventory *)0x0) ||
          (local_99 = EvaluateOperation(this->conditionalOperator + 1,this->conditionalValue + 1,
                                        &pAVar6->Amount), !local_99)) || (local_28 != 0)) {
        if (((pAVar6 == (AInventory *)0x0) || (local_99 == false)) || (local_28 != 1)) {
          if (((pAVar6 == (AInventory *)0x0) || (local_99 == false)) && (local_28 == 0)) {
            local_28 = 2;
          }
        }
        else {
          local_28 = 3;
        }
      }
      else {
        local_28 = 0;
      }
    }
  }
  if (local_28 == 0) {
    CommandDrawImage::Tick(&this->super_CommandDrawImage,block,statusBar,hudChanged);
  }
  else {
    pFVar8 = FImageCollection::operator[]
                       (&statusBar->Images,this->conditionalImage[(int)(local_28 - 1)]);
    (this->super_CommandDrawImage).texture = pFVar8;
    (this->super_CommandDrawImage).alpha = 1.0;
  }
  return;
}

Assistant:

void	Tick(const SBarInfoMainBlock *block, const DSBarInfo *statusBar, bool hudChanged)
		{
			// DrawSwitchable image allows 2 or 4 images to be supplied.
			// drawAlt toggles these:
			// 1 = first image
			// 2 = second image
			// 3 = thrid image
			// 0 = last image
			int drawAlt = 0;
			if(condition == WEAPONSLOT) //weaponslots
			{
				drawAlt = 1; //draw off state until we know we have something.
				for (int i = 0; i < statusBar->CPlayer->weapons.Slots[conditionalValue[0]].Size(); i++)
				{
					PClassActor *weap = statusBar->CPlayer->weapons.Slots[conditionalValue[0]].GetWeapon(i);
					if(weap == NULL)
					{
						continue;
					}
					else if(statusBar->CPlayer->mo->FindInventory(weap) != NULL)
					{
						drawAlt = 0;
						break;
					}
				}
			}
			else if(condition == INVULNERABILITY)
			{
				if(statusBar->CPlayer->cheats&(CF_GODMODE|CF_GODMODE2))
				{
					drawAlt = 1;
				}
			}
			else if(condition == KEYSLOT)
			{
				bool found1 = false;
				bool found2 = false;
				drawAlt = 1;

				for(AInventory *item = statusBar->CPlayer->mo->Inventory;item != NULL;item = item->Inventory)
				{
					if(item->IsKindOf(RUNTIME_CLASS(AKey)))
					{
						int keynum = static_cast<AKey *>(item)->KeyNumber;
						if(keynum)
						{
							if(keynum == conditionalValue[0])
								found1 = true;
							if(conditionAnd && keynum == conditionalValue[1]) // two keys
								found2 = true;
						}
						else
						{
							FName species = item->GetSpecies();
							if(species == keySpecies[0])
								found1 = true;
							if(conditionAnd && species == keySpecies[1])
								found2 = true;
						}
					}
				}

				if(conditionAnd)
				{
					if(found1 && found2)
						drawAlt = 0;
					else if(found1)
						drawAlt = 2;
					else if(found2)
						drawAlt = 3;
				}
				else
				{
					if(found1)
						drawAlt = 0;
				}
			}
			else if(condition == ARMORTYPE)
			{
				ABasicArmor *armor = (ABasicArmor *) statusBar->CPlayer->mo->FindInventory(NAME_BasicArmor);
				if(armor != NULL)
				{
					bool matches1 = armor->ArmorType.GetIndex() == armorType[0] && EvaluateOperation(conditionalOperator[0], conditionalValue[0], armor->Amount);
					bool matches2 = armor->ArmorType.GetIndex() == armorType[1] && EvaluateOperation(conditionalOperator[1], conditionalValue[1], armor->Amount);

					drawAlt = 1;
					if(conditionAnd)
					{
						if(matches1 && matches2)
							drawAlt = 0;
						else if(matches2)
							drawAlt = 3;
						else if(matches1)
							drawAlt = 2;
					}
					else if(matches1)
						drawAlt = 0;
				}
			}
			else //check the inventory items and draw selected sprite
			{
				AInventory* item = statusBar->CPlayer->mo->FindInventory(PClass::FindActor(inventoryItem[0]));
				if(item == NULL || !EvaluateOperation(conditionalOperator[0], conditionalValue[0], item->Amount))
					drawAlt = 1;
				if(conditionAnd)
				{
					item = statusBar->CPlayer->mo->FindInventory(PClass::FindActor(inventoryItem[1]));
					bool secondCondition = item != NULL && EvaluateOperation(conditionalOperator[1], conditionalValue[1], item->Amount);
					if((item != NULL && secondCondition) && drawAlt == 0) //both
					{
						drawAlt = 0;
					}
					else if((item != NULL && secondCondition) && drawAlt == 1) //2nd
					{
						drawAlt = 3;
					}
					else if((item == NULL || !secondCondition) && drawAlt == 0) //1st
					{
						drawAlt = 2;
					}
				}
			}
			if(drawAlt != 0) //draw 'off' image
			{
				texture = statusBar->Images[conditionalImage[drawAlt-1]];

				// Since we're not going to call our parent's tick() method,
				// be sure to set the alpha value properly.
				alpha = 1.;
				return;
			}
			CommandDrawImage::Tick(block, statusBar, hudChanged);
		}